

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O0

void __thiscall BehaviourTree::Invert::~Invert(Invert *this)

{
  Invert *this_local;
  
  DecoratorNode::~DecoratorNode(&this->super_DecoratorNode);
  return;
}

Assistant:

virtual Status run() override {
			Node* child = getChild();
			if (child->dontSkip()) {
				// run at each and every iteration
				const Status s = child->run();
				_lastStatus = s;
				switch (s)
				{
				case Status::SUCCESS: return Status::FAILURE;
				case Status::FAILURE: return Status::SUCCESS;
				default: return s;
				}
			}
			else {
				// if the job has already been done, return the status
				// else execute it
				Status s;
				if (child->isCompleted()) {
					s = child->getLastStatus();
				}
				else {
					s = child->run();
					_lastStatus = s;
					if (s != Status::RUNNING)
						_completed = true;
				}
				switch (s)
				{
				case Status::SUCCESS: return Status::FAILURE;
				case Status::FAILURE: return Status::SUCCESS;
				default: return s;
				}
			}
		}